

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O3

int __thiscall
gl3cts::TransformFeedbackOverflowQueryTests::init
          (TransformFeedbackOverflowQueryTests *this,EVP_PKEY_CTX *ctx)

{
  API AVar1;
  Context *pCVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  AVar1 = this->m_api;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"implementation-dependent-state",
             "Tests whether the implementation dependent state defined by the feature matches the requirements."
            );
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(API *)&pTVar3[1].m_testCtx = AVar1;
  *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c2c48;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  AVar1 = this->m_api;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"default-context-state",
             "Tests whether the new context state defined by the feature has the expected default values."
            );
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(API *)&pTVar3[1].m_testCtx = AVar1;
  *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c2cb0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x88);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  AVar1 = this->m_api;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"context-state-update",
             "Tests whether the new context state defined by the feature is correctly updated after a successful call to {Begin|End}Query[Indexed] if the target of the query is one of the newly introduced ones."
            );
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(API *)&pTVar3[1].m_testCtx = AVar1;
  *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c2d18;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x90);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  AVar1 = this->m_api;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"error-invalid-index",
             "Verifies whether an INVALID_VALUE error is properly generated if GetQueryIndexediv or BeginQueryIndexed is called with an invalid index when using the new targets introduced by the feature."
            );
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(API *)&pTVar3[1].m_testCtx = AVar1;
  *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = 0;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c2d68;
  *(undefined4 *)&pTVar3[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x98);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  AVar1 = this->m_api;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"error-already-active",
             "Verifies whether an INVALID_OPERATION error is properly generated if BeginQuery[Indexed] is used to try to start a query on an index that has already a query active, or the query object itself is active on another index."
            );
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(API *)&pTVar3[1].m_testCtx = AVar1;
  *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = 0;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c2dd0;
  pTVar3[1].m_name._M_string_length = 0;
  pTVar3[1].m_name.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x98);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  AVar1 = this->m_api;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"error-incompatible-target",
             "Verifies whether an INVALID_OPERATION error is properly generated if BeginQuery[Indexed] is called with one of the newly introduced query targets but one that is different than that used earlier on the same query object."
            );
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(API *)&pTVar3[1].m_testCtx = AVar1;
  *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = 0;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_name._M_string_length = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c2e20;
  *(undefined4 *)&pTVar3[1].m_name.field_2 = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x90);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  AVar1 = this->m_api;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"error-no-active-query",
             "Verifies whether an INVALID_OPERATION error is properly generated if EndQuery[Indexed] is called with a target (and index) for which there isn\'t a currently active query."
            );
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(API *)&pTVar3[1].m_testCtx = AVar1;
  *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = 0;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_name._M_string_length = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c2e70;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xb0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  AVar1 = this->m_api;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"basic-single-stream-interleaved-attribs",
             "Basic single stream, interleaved attributes.");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(API *)&pTVar3[1].m_testCtx = AVar1;
  *(undefined8 *)((long)&pTVar3[1].m_testCtx + 4) = 0;
  pTVar3[1].m_name._M_string_length = 0;
  pTVar3[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  pTVar3[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_description._M_string_length = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c2ec0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xb0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  AVar1 = this->m_api;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"basic-single-stream-separate-attribs",
             "Basic single stream, separate attributes.");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(API *)&pTVar3[1].m_testCtx = AVar1;
  *(undefined8 *)((long)&pTVar3[1].m_testCtx + 4) = 0;
  pTVar3[1].m_name._M_string_length = 0;
  pTVar3[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  pTVar3[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_description._M_string_length = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c2f78;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xb0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  AVar1 = this->m_api;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"advanced-single-stream-interleaved-attribs",
             "Advanced single stream, interleaved attributes.");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(API *)&pTVar3[1].m_testCtx = AVar1;
  *(undefined8 *)((long)&pTVar3[1].m_testCtx + 4) = 0;
  pTVar3[1].m_name._M_string_length = 0;
  pTVar3[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  pTVar3[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_description._M_string_length = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c3000;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xb0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  AVar1 = this->m_api;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"advanced-single-stream-separate-attribs",
             "Advanced single stream, separate attributes.");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(API *)&pTVar3[1].m_testCtx = AVar1;
  *(undefined8 *)((long)&pTVar3[1].m_testCtx + 4) = 0;
  pTVar3[1].m_name._M_string_length = 0;
  pTVar3[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  pTVar3[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_description._M_string_length = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c3088;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xb0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  AVar1 = this->m_api;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"multiple-streams-one-buffer-per-stream",
             "Advanced multiple streams, one buffer per stream.");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(API *)&pTVar3[1].m_testCtx = AVar1;
  *(undefined8 *)((long)&pTVar3[1].m_testCtx + 4) = 0;
  pTVar3[1].m_name._M_string_length = 0;
  pTVar3[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  pTVar3[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_description._M_string_length = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c3110;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xb0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  AVar1 = this->m_api;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"multiple-streams-multiple-buffers-per-stream",
             "Advanced multiple streams, multiple buffers per stream.");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(API *)&pTVar3[1].m_testCtx = AVar1;
  *(undefined8 *)((long)&pTVar3[1].m_testCtx + 4) = 0;
  pTVar3[1].m_name._M_string_length = 0;
  pTVar3[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  pTVar3[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_description._M_string_length = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c31b0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  return extraout_EAX;
}

Assistant:

void TransformFeedbackOverflowQueryTests::init(void)
{
	addChild(new TransformFeedbackOverflowQueryImplDepState(m_context, m_api, "implementation-dependent-state"));
	addChild(new TransformFeedbackOverflowQueryDefaultState(m_context, m_api, "default-context-state"));
	addChild(new TransformFeedbackOverflowQueryStateUpdate(m_context, m_api, "context-state-update"));
	addChild(new TransformFeedbackOverflowQueryErrorInvalidIndex(m_context, m_api, "error-invalid-index"));
	addChild(new TransformFeedbackOverflowQueryErrorAlreadyActive(m_context, m_api, "error-already-active"));
	addChild(new TransformFeedbackOverflowQueryErrorIncompatibleTarget(m_context, m_api, "error-incompatible-target"));
	addChild(new TransformFeedbackOverflowQueryErrorNoActiveQuery(m_context, m_api, "error-no-active-query"));
	addChild(new TransformFeedbackOverflowQueryBasicSingleStreamInterleavedAttribs(
		m_context, m_api, "basic-single-stream-interleaved-attribs"));
	addChild(new TransformFeedbackOverflowQueryBasicSingleStreamSeparateAttribs(
		m_context, m_api, "basic-single-stream-separate-attribs"));
	addChild(new TransformFeedbackOverflowQueryAdvancedSingleStreamInterleavedAttribs(
		m_context, m_api, "advanced-single-stream-interleaved-attribs"));
	addChild(new TransformFeedbackOverflowQueryAdvancedSingleStreamSeparateAttribs(
		m_context, m_api, "advanced-single-stream-separate-attribs"));
	addChild(new TransformFeedbackOverflowQueryMultipleStreamsOneBufferPerStream(
		m_context, m_api, "multiple-streams-one-buffer-per-stream"));
	addChild(new TransformFeedbackOverflowQueryMultipleStreamsMultipleBufferPerStream(
		m_context, m_api, "multiple-streams-multiple-buffers-per-stream"));
}